

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

BigNumber *
multiplication_modulaireGN
          (BigNumber *__return_storage_ptr__,BigNumber *a,BigNumber *b,BigNumber *n,int r,
          BigNumber *v,BigNumber *real_r2)

{
  initializer_list<unsigned_int> __l;
  BigNumber c;
  BigNumber b1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber a1;
  BigNumber unite;
  
  a1.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&a1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,__l,
             (allocator_type *)&b1);
  BigNumber::BigNumber
            (&unite,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,a->m_base);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c8);
  montgomery(&a1,a,real_r2,n,r,v);
  montgomery(&b1,b,real_r2,n,r,v);
  BigNumber::BigNumber(&c,&b1);
  montgomery(&local_90,&c,&c,n,r,v);
  BigNumber::operator=(&c,&local_90);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  montgomery(&local_b0,&c,&b1,n,r,v);
  BigNumber::operator=(&c,&local_b0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
  montgomery(__return_storage_ptr__,&c,&unite,n,r,v);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&c);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&b1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&a1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&unite);
  return __return_storage_ptr__;
}

Assistant:

BigNumber multiplication_modulaireGN(BigNumber& a, BigNumber& b, BigNumber& n, int r, BigNumber& v, BigNumber& real_r2){
    BigNumber unite({1}, a.m_base);
    BigNumber a1 = montgomery(a, real_r2, n, r, v);
    BigNumber b1 = montgomery(b, real_r2, n, r, v);
    BigNumber c = b1;
    c = montgomery(c, c, n, r, v);
    c = montgomery(c, b1, n, r, v);

    return montgomery(c, unite, n, r, v);
}